

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O2

void __thiscall
Octree::Update(Octree *this,shared_ptr<myvk::CommandPool> *command_pool,
              shared_ptr<OctreeBuilder> *builder)

{
  DescriptorSet *this_00;
  VkDeviceSize VVar1;
  __shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  VVar1 = OctreeBuilder::GetOctreeRange
                    ((builder->super___shared_ptr<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     ,command_pool);
  std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)this,
             &(((builder->super___shared_ptr<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              m_octree_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  this->m_level =
       ((((builder->super___shared_ptr<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        m_voxelizer_ptr).super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_level;
  VVar1 = VVar1 & 0xffffffff;
  this->m_range = VVar1;
  if ((((this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_BufferBase).m_size < VVar1) {
    spdlog::error<char[19]>((char (*) [19])"Octree size exceed");
    VVar1 = (VkDeviceSize)
            (uint)(((this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_BufferBase).m_size;
  }
  this_00 = (this->m_descriptor_set).
            super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            (local_30,(__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)this);
  myvk::DescriptorSet::UpdateStorageBuffer(this_00,(Ptr<BufferBase> *)local_30,0,0,0,VVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

void Octree::Update(const std::shared_ptr<myvk::CommandPool> &command_pool,
                    const std::shared_ptr<OctreeBuilder> &builder) {
	uint32_t octree_range = builder->GetOctreeRange(command_pool);
	m_buffer = builder->GetOctree();
	m_level = builder->GetLevel();
	m_range = octree_range;

	uint32_t actual_range = octree_range;
	if (m_buffer->GetSize() < actual_range) {
		spdlog::error("Octree size exceed");
		actual_range = m_buffer->GetSize();
	}
	m_descriptor_set->UpdateStorageBuffer(m_buffer, 0, 0, 0, actual_range);
}